

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O0

void __thiscall
QFontEngineMulti::setFallbackFamiliesList(QFontEngineMulti *this,QStringList *fallbackFamilies)

{
  bool bVar1;
  const_reference ppQVar2;
  reference ppQVar3;
  QList<QFontEngine_*> *in_RDI;
  QFontEngine *engine;
  QList<QString> *in_stack_ffffffffffffffc8;
  QList<QString> *in_stack_ffffffffffffffd0;
  QFontEngine *this_00;
  qsizetype in_stack_ffffffffffffffd8;
  
  QList<QString>::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  bVar1 = QList<QString>::isEmpty((QList<QString> *)0x763fde);
  if (bVar1) {
    ppQVar2 = QList<QFontEngine_*>::at
                        ((QList<QFontEngine_*> *)in_stack_ffffffffffffffd0,
                         (qsizetype)in_stack_ffffffffffffffc8);
    this_00 = *ppQVar2;
    QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x76400f);
    ppQVar3 = QList<QFontEngine_*>::operator[]
                        ((QList<QFontEngine_*> *)this_00,(qsizetype)in_stack_ffffffffffffffc8);
    *ppQVar3 = this_00;
    QList<QString>::constFirst((QList<QString> *)this_00);
    QList<QString>::operator<<((QList<QString> *)this_00,(parameter_type)in_stack_ffffffffffffffc8);
  }
  else {
    QList<QString>::size((QList<QString> *)&in_RDI[0xb].d.ptr);
    QList<QFontEngine_*>::resize(in_RDI,in_stack_ffffffffffffffd8);
  }
  *(undefined1 *)((long)&in_RDI[0xc].d.ptr + 4) = 1;
  return;
}

Assistant:

void QFontEngineMulti::setFallbackFamiliesList(const QStringList &fallbackFamilies)
{
    Q_ASSERT(!m_fallbackFamiliesQueried);

    m_fallbackFamilies = fallbackFamilies;
    if (m_fallbackFamilies.isEmpty()) {
        // turns out we lied about having any fallback at all
        Q_ASSERT(m_engines.size() == 2); // see c-tor for details
        QFontEngine *engine = m_engines.at(0);
        engine->ref.ref();
        m_engines[1] = engine;
        m_fallbackFamilies << fontDef.families.constFirst();
    } else {
        m_engines.resize(m_fallbackFamilies.size() + 1);
    }

    m_fallbackFamiliesQueried = true;
}